

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O0

string * draco::RemoveFileExtension(string *filename)

{
  long lVar1;
  long lVar2;
  string *in_RSI;
  string *in_RDI;
  size_t pos;
  
  lVar1 = std::__cxx11::string::find_last_of((char)in_RSI,0x2e);
  if (((lVar1 != 0) && (lVar1 != -1)) &&
     (lVar2 = std::__cxx11::string::length(), lVar1 != lVar2 + -1)) {
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)in_RSI);
    return in_RDI;
  }
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string RemoveFileExtension(const std::string &filename) {
  const size_t pos = filename.find_last_of('.');
  if (pos == 0 || pos == std::string::npos || pos == filename.length() - 1) {
    return filename;
  }
  return filename.substr(0, pos);
}